

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImU32 ImHashStr(char *data_p,size_t data_size,ImU32 seed)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar3 = ~seed;
  pcVar5 = data_p + 2;
  uVar2 = uVar3;
  if (data_size == 0) {
    for (; bVar1 = pcVar5[-2], bVar1 != 0; pcVar5 = pcVar5 + 1) {
      if (((bVar1 == 0x23) && (pcVar5[-1] == '#')) && (*pcVar5 == '#')) {
        uVar2 = uVar3;
      }
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[uVar2 & 0xff ^ (uint)bVar1];
    }
  }
  else {
    for (uVar4 = data_size - 1; uVar4 != 0xffffffffffffffff; uVar4 = uVar4 - 1) {
      if (((1 < uVar4 && (byte)pcVar5[-2] == 0x23) && (pcVar5[-1] == '#')) && (*pcVar5 == '#')) {
        uVar2 = uVar3;
      }
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[uVar2 & 0xff ^ (uint)(byte)pcVar5[-2]];
      pcVar5 = pcVar5 + 1;
    }
  }
  return ~uVar2;
}

Assistant:

ImU32 ImHashStr(const char* data_p, size_t data_size, ImU32 seed)
{
    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    if (data_size != 0)
    {
        while (data_size-- != 0)
        {
            unsigned char c = *data++;
            if (c == '#' && data_size >= 2 && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    else
    {
        while (unsigned char c = *data++)
        {
            if (c == '#' && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}